

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qpXmlWriter.c
# Opt level: O0

deBool qpXmlWriter_writeBase64(qpXmlWriter *writer,deUint8 *data,size_t numBytes)

{
  bool bVar1;
  int iVar2;
  char *pcVar3;
  uint local_58;
  uint local_54;
  char local_50;
  char local_4f;
  char local_4e;
  char local_4d;
  undefined1 local_4c;
  undefined1 local_4b;
  undefined1 local_4a;
  byte local_49;
  char d [5];
  deUint8 s2;
  deUint8 s1;
  deUint8 s0;
  size_t numRead;
  char *indentStr;
  ulong uStack_30;
  deBool writeIndent;
  size_t srcNdx;
  int numWritten;
  size_t numBytes_local;
  deUint8 *data_local;
  qpXmlWriter *writer_local;
  
  srcNdx._4_4_ = 0;
  uStack_30 = 0;
  bVar1 = true;
  pcVar3 = getIndentStr(writer->xmlElementDepth);
  closePending(writer);
  while (uStack_30 < numBytes) {
    iVar2 = deMin32(3,(int)numBytes - (int)uStack_30);
    _d = (ulong)iVar2;
    local_49 = data[uStack_30];
    if (_d < 2) {
      local_54 = 0;
    }
    else {
      local_54 = (uint)data[uStack_30 + 1];
    }
    local_4a = (undefined1)local_54;
    if (_d < 3) {
      local_58 = 0;
    }
    else {
      local_58 = (uint)data[uStack_30 + 2];
    }
    local_4b = (undefined1)local_58;
    uStack_30 = _d + uStack_30;
    local_50 = "ABCDEFGHIJKLMNOPQRSTUVWXYZabcdefghijklmnopqrstuvwxyz0123456789+/"
               [(int)(uint)local_49 >> 2];
    local_4f = "ABCDEFGHIJKLMNOPQRSTUVWXYZabcdefghijklmnopqrstuvwxyz0123456789+/"
               [(int)((local_49 & 3) << 4 | (int)local_54 >> 4)];
    local_4e = "ABCDEFGHIJKLMNOPQRSTUVWXYZabcdefghijklmnopqrstuvwxyz0123456789+/"
               [(int)((local_54 & 0xf) << 2 | (int)local_58 >> 6)];
    local_4d = "ABCDEFGHIJKLMNOPQRSTUVWXYZabcdefghijklmnopqrstuvwxyz0123456789+/"
               [(int)(local_58 & 0x3f)];
    local_4c = 0;
    if (_d < 3) {
      local_4d = '=';
    }
    if (_d < 2) {
      local_4e = '=';
    }
    if (bVar1) {
      fprintf((FILE *)writer->outputFile,"%s",pcVar3);
      bVar1 = false;
    }
    fprintf((FILE *)writer->outputFile,"%s",&local_50);
    srcNdx._4_4_ = srcNdx._4_4_ + 4;
    if (0x3f < srcNdx._4_4_) {
      fprintf((FILE *)writer->outputFile,"\n");
      srcNdx._4_4_ = 0;
      bVar1 = true;
    }
  }
  if (0 < srcNdx._4_4_) {
    fprintf((FILE *)writer->outputFile,"\n");
  }
  return 1;
}

Assistant:

deBool qpXmlWriter_writeBase64 (qpXmlWriter* writer, const deUint8* data, size_t numBytes)
{
	static const char s_base64Table[64] =
	{
		'A','B','C','D','E','F','G','H','I','J','K','L','M',
		'N','O','P','Q','R','S','T','U','V','W','X','Y','Z',
		'a','b','c','d','e','f','g','h','i','j','k','l','m',
		'n','o','p','q','r','s','t','u','v','w','x','y','z',
		'0','1','2','3','4','5','6','7','8','9','+','/'
	};

	int			numWritten	= 0;
	size_t		srcNdx		= 0;
	deBool		writeIndent	= DE_TRUE;
	const char*	indentStr	= getIndentStr(writer->xmlElementDepth);

	DE_ASSERT(writer && data && (numBytes > 0));

	/* Close and pending writes. */
	closePending(writer);

	/* Loop all input chars. */
	while (srcNdx < numBytes)
	{
		size_t	numRead = (size_t)deMin32(3, (int)(numBytes - srcNdx));
		deUint8	s0 = data[srcNdx];
		deUint8	s1 = (numRead >= 2) ? data[srcNdx+1] : 0;
		deUint8	s2 = (numRead >= 3) ? data[srcNdx+2] : 0;
		char	d[5];

		srcNdx += numRead;

		d[0] = s_base64Table[s0 >> 2];
		d[1] = s_base64Table[((s0&0x3)<<4) | (s1>>4)];
		d[2] = s_base64Table[((s1&0xF)<<2) | (s2>>6)];
		d[3] = s_base64Table[s2&0x3F];
		d[4] = 0;

		if (numRead < 3) d[3] = '=';
		if (numRead < 2) d[2] = '=';

		/* Write indent (if needed). */
		if (writeIndent)
		{
			fprintf(writer->outputFile, "%s", indentStr);
			writeIndent = DE_FALSE;
		}

		/* Write data. */
		fprintf(writer->outputFile, "%s", &d[0]);

		/* EOL every now and then. */
		numWritten += 4;
		if (numWritten >= 64)
		{
			fprintf(writer->outputFile, "\n");
			numWritten = 0;
			writeIndent = DE_TRUE;
		}
	}

	/* Last EOL. */
	if (numWritten > 0)
		fprintf(writer->outputFile, "\n");

	DE_ASSERT(srcNdx == numBytes);
	return DE_TRUE;
}